

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O3

double getAveLen(Mesh *mesh,VectorXd *x)

{
  int iVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  __begin1;
  undefined1 local_60 [16];
  undefined8 local_50;
  double local_48;
  double local_40;
  double local_38;
  
  auVar9 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)mesh);
  local_60 = auVar9;
  auVar10 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
  local_50 = auVar10._8_8_;
  if (auVar9._8_4_ == auVar10._8_4_ && auVar9._0_8_ == auVar10._0_8_) {
    local_38 = NAN;
  }
  else {
    local_38 = 0.0;
    iVar6 = 0;
    do {
      lVar8 = *(long *)&(mesh->super_Mesh).
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                        .super_PolyConnectivity.field_0xe0;
      lVar5 = ((auVar9._8_8_ << 0x21) >> 0x21) * 0x20;
      iVar7 = *(int *)(lVar8 + 4 + lVar5);
      iVar1 = *(int *)(lVar8 + 0x14 + lVar5);
      pdVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      local_40 = pdVar2[(long)iVar7 * 2] - pdVar2[(long)iVar1 * 2];
      local_48 = pdVar2[iVar7 * 2 + 1] - pdVar2[iVar1 * 2 + 1];
      iVar7 = auVar9._8_4_ + 1;
      local_60._8_4_ = iVar7;
      lVar8 = auVar9._0_8_;
      if (local_60._12_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                    *)local_60);
        lVar8 = local_60._0_8_;
        iVar7 = local_60._8_4_;
      }
      auVar4._8_8_ = local_60._8_8_;
      auVar4._0_8_ = local_60._0_8_;
      auVar3._8_4_ = iVar7;
      auVar3._0_8_ = lVar8;
      auVar3._12_4_ = 0;
      auVar9._8_4_ = iVar7;
      auVar9._0_8_ = lVar8;
      auVar9._12_4_ = 0;
      local_38 = local_38 + SQRT(local_48 * local_48 + local_40 * local_40);
      iVar6 = iVar6 + 1;
    } while ((lVar8 != auVar10._0_8_) ||
            (auVar9 = auVar3, local_60 = auVar4, iVar7 != (int)local_50));
    local_38 = local_38 / (double)iVar6;
  }
  return local_38;
}

Assistant:

double getAveLen(const Mesh& mesh, const Eigen::VectorXd& x) {
    int count = 0;
    double len = 0.0;
    for (auto e: mesh.all_edges()) {
        ++count;
        int st = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
        int end = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
        OpenMesh::Vec2d ev(x[2 * st] - x[2 *end], x[2 * st + 1] - x[2 * end + 1]);
        len += ev.norm();
    }

    return len / count; 
}